

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateClearFunctionDeclaration
          (OneofGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "/**\n * Clears whatever value was set for the oneof \'$name$\'.\n **/\nvoid $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message);\n"
                    );
  return;
}

Assistant:

void OneofGenerator::GenerateClearFunctionDeclaration(io::Printer* printer) {
  printer->Print(
      variables_,
      "/**\n"
      " * Clears whatever value was set for the oneof '$name$'.\n"
      " **/\n"
      "void $owning_message_class$_Clear$capitalized_name$OneOfCase($owning_message_class$ *message);\n");
}